

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O0

void __thiscall QZipReader::QZipReader(QZipReader *this,QString *archive,OpenMode mode)

{
  long lVar1;
  uint uVar2;
  FileError FVar3;
  pointer pQVar4;
  QZipReaderPrivate *this_00;
  uint in_EDX;
  long *in_RDI;
  long in_FS_OFFSET;
  FileError error;
  Status status;
  bool result;
  __single_object f;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QIODevice *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<QFile,QString_const&>
            ((QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pQVar4 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                     ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x31f391);
  uVar2 = (*(pQVar4->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])
                    (pQVar4,(ulong)in_EDX);
  std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x31f3cb);
  FVar3 = QFileDevice::error((QFileDevice *)
                             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (((uVar2 & 1) == 0) || (FVar3 != NoError)) {
    if (FVar3 == ReadError) {
      local_48 = 1;
    }
    else if (FVar3 == OpenError) {
      local_48 = 2;
    }
    else if (FVar3 == PermissionsError) {
      local_48 = 3;
    }
    else {
      local_48 = 4;
    }
  }
  else {
    local_48 = 0;
  }
  this_00 = (QZipReaderPrivate *)operator_new(0x48);
  std::unique_ptr<QFile,_std::default_delete<QFile>_>::get
            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  QZipReaderPrivate::QZipReaderPrivate
            (this_00,in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  *in_RDI = (long)this_00;
  std::unique_ptr<QFile,_std::default_delete<QFile>_>::release
            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x31f49c);
  *(undefined4 *)(*in_RDI + 0x44) = local_48;
  std::unique_ptr<QFile,_std::default_delete<QFile>_>::~unique_ptr
            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QZipReader::QZipReader(const QString &archive, QIODevice::OpenMode mode)
{
    auto f = std::make_unique<QFile>(archive);
    const bool result = f->open(mode);
    QZipReader::Status status;
    const QFileDevice::FileError error = f->error();
    if (result && error == QFile::NoError) {
        status = NoError;
    } else {
        if (error == QFile::ReadError)
            status = FileReadError;
        else if (error == QFile::OpenError)
            status = FileOpenError;
        else if (error == QFile::PermissionsError)
            status = FilePermissionsError;
        else
            status = FileError;
    }

    d = new QZipReaderPrivate(f.get(), /*ownDevice=*/true);
    Q_UNUSED(f.release());
    d->status = status;
}